

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaMan.c
# Opt level: O2

Vec_Int_t * Pla_GenPrimes(int nVars)

{
  int iVar1;
  Vec_Int_t *p;
  int *piVar2;
  Vec_Bit_t *p_00;
  int i;
  
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 1000;
  p->nSize = 0;
  piVar2 = (int *)malloc(4000);
  p->pArray = piVar2;
  p_00 = Pla_ManPrimesTable(nVars);
  for (i = 2; i < 1 << ((byte)nVars & 0x1f); i = i + 1) {
    iVar1 = Vec_BitEntry(p_00,i);
    if (iVar1 != 0) {
      Vec_IntPush(p,i);
    }
  }
  printf("Primes up to 2^%d = %d\n",nVars,(ulong)(uint)p->nSize);
  Vec_BitFree(p_00);
  return p;
}

Assistant:

Vec_Int_t * Pla_GenPrimes( int nVars )
{
    int n, nBits = ( 1 << nVars );
    Vec_Int_t * vPrimes = Vec_IntAlloc( 1000 );
    Vec_Bit_t * vMap = Pla_ManPrimesTable( nVars );
    for ( n = 2; n < nBits; n++ )
        if ( Vec_BitEntry(vMap, n) )
            Vec_IntPush( vPrimes, n );
    printf( "Primes up to 2^%d = %d\n", nVars, Vec_IntSize(vPrimes) );
//    Abc_GenCountHits1( vMap, vPrimes, nVars );
    Vec_BitFree( vMap );
    return vPrimes;
}